

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# l2_gc.c
# Opt level: O1

void l2_gc_increase_ref_count(l2_gc_list *gc_list_p,void *managed_mem_p)

{
  _l2_gc_mem_node *p_Var1;
  
  for (p_Var1 = gc_list_p->head_p;
      (p_Var1 != (_l2_gc_mem_node *)0x0 && (p_Var1->managed_mem_p != managed_mem_p));
      p_Var1 = p_Var1->next) {
  }
  if (p_Var1 != (_l2_gc_mem_node *)0x0) {
    p_Var1->ref_count = p_Var1->ref_count + 1;
    return;
  }
  l2_internal_error(L2_INTERNAL_ERROR_MEM_BLOCK_NOT_IN_GC);
}

Assistant:

void l2_gc_increase_ref_count(l2_gc_list *gc_list_p, void *managed_mem_p) {
    l2_gc_mem_node *gc_mem_node_p = l2_gc_get_mem_node(gc_list_p, managed_mem_p);
    if (!gc_mem_node_p) l2_internal_error(L2_INTERNAL_ERROR_MEM_BLOCK_NOT_IN_GC, managed_mem_p);
    gc_mem_node_p->ref_count += 1;
}